

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O3

void __thiscall hwnet::TCPSocket::OnActive(TCPSocket *this,int event)

{
  mutex *__mutex;
  Poller *pPVar1;
  bool bVar2;
  int iVar3;
  int *__optval;
  undefined1 auStack_48 [8];
  int optval;
  element_type *peStack_38;
  socklen_t optlen;
  
  if ((event & 4U) != 0) {
    pPVar1 = this->poller_;
    std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::TCPSocket,void>
              ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)&peStack_38,
               (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<hwnet::TCPSocket>);
    auStack_48 = (undefined1  [8])peStack_38;
    if (peStack_38 != (element_type *)0x0) {
      auStack_48 = (undefined1  [8])&peStack_38->events;
    }
    _optval = _optlen;
    peStack_38 = (element_type *)0x0;
    _optlen = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Poller::Disable(pPVar1,(Ptr *)auStack_48,4);
    if (_optval != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_optval);
    }
    if (_optlen != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_optlen);
    }
  }
  __mutex = &this->mtx;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 == 0) {
    if ((event & 1U) != 0) {
      this->readableVer = this->readableVer + 1;
      this->readable = true;
    }
    if ((event & 4U) != 0) {
      this->writeableVer = this->writeableVer + 1;
      this->writeable = true;
    }
    if ((event & 0x2018U) != 0) {
      peStack_38 = (element_type *)CONCAT44(peStack_38._4_4_,4);
      __optval = (int *)auStack_48;
      iVar3 = getsockopt(this->fd,1,4,__optval,(socklen_t *)&peStack_38);
      if (iVar3 < 0) {
        __optval = __errno_location();
      }
      this->err = *__optval;
      this->socketError = true;
    }
    if (((((this->readable == true) &&
          ((this->recvList).
           super__List_base<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>
           ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&this->recvList)) ||
         (this->socketError != false)) || (bVar2 = canWrite(this), bVar2)) && (this->doing == false)
       ) {
      this->doing = true;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pPVar1 = this->poller_;
      std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<hwnet::TCPSocket,void>
                ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)&peStack_38,
                 (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<hwnet::TCPSocket>);
      auStack_48 = (undefined1  [8])peStack_38;
      _optval = _optlen;
      peStack_38 = (element_type *)0x0;
      _optlen = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Poller::PostTask(pPVar1,(Ptr *)auStack_48,this->pool_);
      if (_optval != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_optval);
      }
      if (_optlen == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_optlen);
      return;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void TCPSocket::OnActive(int event) {
	auto post = false;

	if(event & Poller::WriteFlag()){
		this->poller_->Disable(shared_from_this(),Poller::Write);
	}

	this->mtx.lock();
	if(event & Poller::ReadFlag()) {
		++this->readableVer;
		this->readable = true;
	}

	if(event & Poller::WriteFlag()){
		++this->writeableVer;
		this->writeable = true;
	}

	if(event & Poller::ErrorFlag()) {
  		int optval;
  		socklen_t optlen = static_cast<socklen_t>(sizeof optval);
  		if (::getsockopt(this->fd, SOL_SOCKET, SO_ERROR, &optval, &optlen) < 0) {
    		err = errno;
  		} else {
  			err = optval;
  		}
		this->socketError = true;
	}

	if((canRead() || canWrite()) && !doing) {
		this->doing = true;
		post = true;
	}
	this->mtx.unlock();

	if(post) {
		poller_->PostTask(shared_from_this(),this->pool_);
	}
}